

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O1

Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readAnyValue_abi_cxx11_
          (Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  undefined8 uVar4;
  size_type *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t *psVar8;
  pointer pcVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  YamlEvent event;
  YamlEvent event_1;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result_1;
  undefined1 local_140 [8];
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  undefined1 auStack_108 [24];
  size_t local_f0;
  bool local_e8;
  size_type *local_e0;
  undefined1 local_d8 [24];
  char acStack_c0 [16];
  bool local_b0;
  ParserContext *local_a8;
  undefined1 local_a0 [40];
  bool local_78 [8];
  _Rb_tree_node_base local_70;
  size_t local_50;
  vector<yaml::Value,_std::allocator<yaml::Value>_> vStack_48;
  
  _Var2._M_p = local_d8 + 0x10;
  local_e0 = &(__return_storage_ptr__->field_0).value_.string_._M_string_length;
  iVar12 = 0;
  local_a8 = this;
  do {
    iVar11 = iVar12;
    pcVar9 = local_a0 + 0x18;
    if (iVar11 == 2) goto LAB_00149681;
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,local_a8);
    psVar5 = local_e0;
    iVar12 = iVar11;
    if (local_78[0] == false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      auStack_108._0_8_ = local_d8._16_8_;
      if ((pointer)local_d8._0_8_ == _Var2._M_p) {
        auStack_108[8] = acStack_c0[0];
        auStack_108[9] = acStack_c0[1];
        auStack_108[10] = acStack_c0[2];
        auStack_108[0xb] = acStack_c0[3];
        auStack_108[0xc] = acStack_c0[4];
        auStack_108[0xd] = acStack_c0[5];
        auStack_108[0xe] = acStack_c0[6];
        auStack_108[0xf] = acStack_c0[7];
        local_118._0_8_ = auStack_108;
      }
      else {
        local_118._0_8_ = local_d8._0_8_;
      }
      local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
      *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
      if ((undefined1 *)local_118._0_8_ == auStack_108) {
        *local_e0 = auStack_108._0_8_;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_e0 + 1))->_M_allocated_capacity = auStack_108._8_8_;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_118._0_8_;
        (__return_storage_ptr__->field_0).value_.string_._M_string_length = auStack_108._0_8_;
      }
      (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p = (pointer)local_d8._8_8_;
      auStack_108._0_8_ = auStack_108._0_8_ & 0xffffffffffffff00;
      __return_storage_ptr__->has_value_ = false;
      local_d8._8_8_ = (char *)0x0;
      local_118._8_8_ = (pointer)0x0;
      bVar3 = false;
      local_118._0_8_ = auStack_108;
      local_d8._0_8_ = _Var2._M_p;
    }
    else {
      local_118._0_4_ = local_a0._0_4_;
      local_118._8_8_ = auStack_108 + 8;
      if ((pointer)local_a0._8_8_ == pcVar9) {
        auStack_108._16_8_ = local_a0._32_8_;
      }
      else {
        local_118._8_8_ = local_a0._8_8_;
      }
      auStack_108._8_8_ = local_a0._24_8_;
      auStack_108._0_8_ = local_a0._16_8_;
      local_a0._16_8_ = 0;
      local_a0._24_8_ = local_a0._24_8_ & 0xffffffffffffff00;
      local_a0._8_8_ = pcVar9;
      if (local_a0._0_4_ == YAML_DOCUMENT_START_EVENT) {
        if (iVar11 != 1) {
          local_140 = (undefined1  [8])&local_130;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,"Unexpected YAML_DOCUMENT_START_EVENT","");
          uVar4 = local_130._M_allocated_capacity;
          if (local_140 == (undefined1  [8])&local_130) {
            acStack_c0[0] = local_130._M_local_buf[8];
            acStack_c0[1] = local_130._M_local_buf[9];
            acStack_c0[2] = local_130._M_local_buf[10];
            acStack_c0[3] = local_130._M_local_buf[0xb];
            acStack_c0[4] = local_130._M_local_buf[0xc];
            acStack_c0[5] = local_130._M_local_buf[0xd];
            acStack_c0[6] = local_130._M_local_buf[0xe];
            acStack_c0[7] = local_130._M_local_buf[0xf];
            local_d8._0_8_ = _Var2._M_p;
          }
          else {
            local_d8._0_8_ = local_140;
          }
          local_d8._16_8_ = local_130._M_allocated_capacity;
          local_130._M_allocated_capacity = local_130._M_allocated_capacity & 0xffffffffffffff00;
          *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
          if ((pointer)local_d8._0_8_ != _Var2._M_p) goto LAB_001495ed;
          *local_e0 = uVar4;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e0 + 1))->_M_allocated_capacity = acStack_c0._0_8_;
          goto LAB_001495fc;
        }
        bVar3 = true;
        iVar12 = 2;
      }
      else {
        if (local_a0._0_4_ == YAML_STREAM_START_EVENT) {
          if (iVar11 == 0) {
            bVar3 = true;
            iVar12 = 1;
            goto LAB_00149637;
          }
          local_140 = (undefined1  [8])&local_130;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,"Unexpected YAML_STREAM_START_EVENT","");
        }
        else {
          format_abi_cxx11_((string *)local_140,"Unexpected event %d");
        }
        uVar4 = local_130._M_allocated_capacity;
        if (local_140 == (undefined1  [8])&local_130) {
          acStack_c0[0] = local_130._M_local_buf[8];
          acStack_c0[1] = local_130._M_local_buf[9];
          acStack_c0[2] = local_130._M_local_buf[10];
          acStack_c0[3] = local_130._M_local_buf[0xb];
          acStack_c0[4] = local_130._M_local_buf[0xc];
          acStack_c0[5] = local_130._M_local_buf[0xd];
          acStack_c0[6] = local_130._M_local_buf[0xe];
          acStack_c0[7] = local_130._M_local_buf[0xf];
          local_d8._0_8_ = _Var2._M_p;
        }
        else {
          local_d8._0_8_ = local_140;
        }
        local_d8._16_8_ = local_130._M_allocated_capacity;
        local_130._M_allocated_capacity = local_130._M_allocated_capacity & 0xffffffffffffff00;
        *(size_type **)&__return_storage_ptr__->field_0 = psVar5;
        if ((pointer)local_d8._0_8_ == _Var2._M_p) {
          *psVar5 = uVar4;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(psVar5 + 1))->_M_allocated_capacity = acStack_c0._0_8_;
        }
        else {
LAB_001495ed:
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_d8._0_8_
          ;
          (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_d8._16_8_;
        }
LAB_001495fc:
        (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p = local_138;
        local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
        __return_storage_ptr__->has_value_ = false;
        local_d8._8_8_ = (char *)0x0;
        local_138 = (char *)0x0;
        bVar3 = false;
        local_140 = (undefined1  [8])&local_130;
        local_d8._0_8_ = _Var2._M_p;
      }
LAB_00149637:
      if ((pointer)local_118._8_8_ != (pointer)(auStack_108 + 8)) {
        operator_delete((void *)local_118._8_8_,(ulong)(auStack_108._8_8_ + 1));
      }
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_a0);
  } while (bVar3);
  if (iVar11 == 2) {
LAB_00149681:
    pcVar10 = local_a0 + 0x18;
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d8,local_a8);
    uVar6 = acStack_c0._0_8_;
    uVar4 = local_d8._16_8_;
    if (local_b0 == false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      local_a0._16_8_ = auStack_108._0_8_;
      uVar4 = local_118._8_8_;
      _Var2._M_p = local_a0 + 0x10;
      if ((undefined1 *)local_118._0_8_ == auStack_108) {
        local_a0._24_8_ = auStack_108._8_8_;
        local_a0._0_8_ = _Var2._M_p;
      }
      else {
        local_a0._0_8_ = local_118._0_8_;
      }
      local_118._8_8_ = (pointer)0x0;
      auStack_108._0_8_ = auStack_108._0_8_ & 0xffffffffffffff00;
      *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
      if ((pointer)local_a0._0_8_ == _Var2._M_p) {
        *local_e0 = local_a0._16_8_;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_e0 + 1))->_M_allocated_capacity = local_a0._24_8_;
      }
      else {
        *(undefined8 *)&__return_storage_ptr__->field_0 = local_a0._0_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_a0._16_8_;
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar4;
      local_a0._8_8_ = (char *)0x0;
      local_a0._16_8_ = local_a0._16_8_ & 0xffffffffffffff00;
      __return_storage_ptr__->has_value_ = false;
      local_118._0_8_ = auStack_108;
      local_a0._0_8_ = _Var2._M_p;
    }
    else {
      pcVar1 = local_130._M_local_buf + 8;
      local_140._0_4_ = local_d8._0_4_;
      if ((char *)local_d8._8_8_ == acStack_c0) {
        uStack_120._0_1_ = acStack_c0[8];
        uStack_120._1_1_ = acStack_c0[9];
        uStack_120._2_1_ = acStack_c0[10];
        uStack_120._3_1_ = acStack_c0[0xb];
        uStack_11c._0_1_ = acStack_c0[0xc];
        uStack_11c._1_1_ = acStack_c0[0xd];
        uStack_11c._2_1_ = acStack_c0[0xe];
        uStack_11c._3_1_ = acStack_c0[0xf];
        local_138 = pcVar1;
      }
      else {
        local_138 = (char *)local_d8._8_8_;
      }
      local_130._M_local_buf[8] = acStack_c0[0];
      local_130._M_local_buf[9] = acStack_c0[1];
      local_130._M_local_buf[10] = acStack_c0[2];
      local_130._M_local_buf[0xb] = acStack_c0[3];
      local_130._M_local_buf[0xc] = acStack_c0[4];
      local_130._M_local_buf[0xd] = acStack_c0[5];
      local_130._M_local_buf[0xe] = acStack_c0[6];
      local_130._M_local_buf[0xf] = acStack_c0[7];
      local_130._M_allocated_capacity = local_d8._16_8_;
      local_d8._16_8_ = 0;
      acStack_c0._0_8_ = acStack_c0._0_8_ & 0xffffffffffffff00;
      uVar7 = acStack_c0._0_8_;
      local_d8._8_8_ = acStack_c0;
      if (local_d8._0_4_ == YAML_MAPPING_START_EVENT) {
        readMapping_abi_cxx11_
                  ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_118,local_a8);
        if (local_e8 == false) {
          _Var2._M_p = local_a0 + 0x10;
          local_a0._0_8_ = _Var2._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,local_118._0_8_,(pointer)(local_118._8_8_ + local_118._0_8_)
                    );
          *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
          if ((pointer)local_a0._0_8_ == _Var2._M_p) {
            *local_e0 = local_a0._16_8_;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_e0 + 1))->_M_allocated_capacity = local_a0._24_8_;
          }
          else {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 (pointer)local_a0._0_8_;
            (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_a0._16_8_;
          }
          (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p =
               (pointer)local_a0._8_8_;
          local_a0._8_8_ = (char *)0x0;
          local_a0._16_8_ = local_a0._16_8_ & 0xffffffffffffff00;
          __return_storage_ptr__->has_value_ = false;
          local_a0._0_8_ = _Var2._M_p;
        }
        else {
          local_a0._0_4_ = 1;
          local_a0._16_8_ = 0;
          local_a0._24_8_ = local_a0._24_8_ & 0xffffffffffffff00;
          if (auStack_108._0_8_ == 0) {
            psVar8 = &local_50;
            local_70._M_color = _S_red;
            local_70._M_parent = (_Base_ptr)0x0;
            local_70._M_left = &local_70;
            local_70._M_right = &local_70;
          }
          else {
            local_70._M_color = local_118._8_4_;
            local_70._M_parent = (_Base_ptr)auStack_108._0_8_;
            local_70._M_left = (_Base_ptr)auStack_108._8_8_;
            local_70._M_right = (_Base_ptr)auStack_108._16_8_;
            *(_Rb_tree_node_base **)(auStack_108._0_8_ + 8) = &local_70;
            psVar8 = &local_f0;
            local_50 = local_f0;
            auStack_108._0_8_ = 0;
            auStack_108._8_8_ = (_Rb_tree_node_base *)(local_118 + 8);
            auStack_108._16_8_ = (_Rb_tree_node_base *)(local_118 + 8);
          }
          local_a0._8_8_ = pcVar10;
          *psVar8 = 0;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(Value *)local_a0);
          std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_48);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                       *)local_78);
          if ((char *)local_a0._8_8_ != pcVar10) {
            operator_delete((void *)local_a0._8_8_,(ulong)(local_a0._24_8_ + 1));
          }
        }
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_118);
      }
      else if (local_d8._0_4_ == YAML_SEQUENCE_START_EVENT) {
        readSequence_abi_cxx11_
                  ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_118,local_a8);
        if ((bool)auStack_108[0x10] == false) {
          _Var2._M_p = local_a0 + 0x10;
          local_a0._0_8_ = _Var2._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,local_118._0_8_,(pointer)(local_118._8_8_ + local_118._0_8_)
                    );
          *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
          if ((pointer)local_a0._0_8_ == _Var2._M_p) {
            *local_e0 = local_a0._16_8_;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_e0 + 1))->_M_allocated_capacity = local_a0._24_8_;
          }
          else {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 (pointer)local_a0._0_8_;
            (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_a0._16_8_;
          }
          (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p =
               (pointer)local_a0._8_8_;
          local_a0._8_8_ = (char *)0x0;
          local_a0._16_8_ = local_a0._16_8_ & 0xffffffffffffff00;
          __return_storage_ptr__->has_value_ = false;
          local_a0._0_8_ = _Var2._M_p;
        }
        else {
          local_70._M_left = &local_70;
          local_a0._0_4_ = 2;
          local_a0._16_8_ = 0;
          local_a0._24_8_ = local_a0._24_8_ & 0xffffffffffffff00;
          local_70._M_color = _S_red;
          local_70._M_parent = (_Base_ptr)0x0;
          local_50 = 0;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
          vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)auStack_108._0_8_;
          local_118._0_8_ = (pointer)0x0;
          local_118._8_8_ = (pointer)0x0;
          auStack_108._0_8_ = 0;
          local_a0._8_8_ = pcVar10;
          local_70._M_right = local_70._M_left;
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(Value *)local_a0);
          std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_48);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                       *)local_78);
          if ((char *)local_a0._8_8_ != pcVar10) {
            operator_delete((void *)local_a0._8_8_,(ulong)(local_a0._24_8_ + 1));
          }
        }
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_118);
      }
      else if (local_d8._0_4_ == YAML_SCALAR_EVENT) {
        local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
        if (local_138 == pcVar1) {
          local_a0._32_8_ = CONCAT44(uStack_11c,uStack_120);
          local_a0._8_8_ = pcVar10;
        }
        else {
          local_a0._8_8_ = local_138;
        }
        acStack_c0[0] = (char)uVar6;
        acStack_c0[1] = SUB81(uVar6,1);
        acStack_c0[2] = SUB81(uVar6,2);
        acStack_c0[3] = SUB81(uVar6,3);
        acStack_c0[4] = SUB81(uVar6,4);
        acStack_c0[5] = SUB81(uVar6,5);
        acStack_c0[6] = SUB81(uVar6,6);
        acStack_c0[7] = SUB81(uVar6,7);
        local_a0[0x18] = acStack_c0[0];
        local_a0[0x19] = acStack_c0[1];
        local_a0[0x1a] = acStack_c0[2];
        local_a0[0x1b] = acStack_c0[3];
        local_a0[0x1c] = acStack_c0[4];
        local_a0[0x1d] = acStack_c0[5];
        local_a0[0x1e] = acStack_c0[6];
        local_a0[0x1f] = acStack_c0[7];
        local_70._M_left = &local_70;
        local_a0._16_8_ = uVar4;
        local_130._M_allocated_capacity = 0;
        local_130._8_8_ = uVar6 & 0xffffffffffffff00;
        local_70._M_color = _S_red;
        local_70._M_parent = (_Base_ptr)0x0;
        local_50 = 0;
        vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138 = pcVar1;
        acStack_c0._0_8_ = uVar7;
        local_70._M_right = local_70._M_left;
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(Value *)local_a0);
        std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_48);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                     *)local_78);
        if ((char *)local_a0._8_8_ != pcVar10) {
          operator_delete((void *)local_a0._8_8_,(ulong)(local_a0._24_8_ + 1));
        }
      }
      else {
        format_abi_cxx11_((string *)local_118,"Unexpected event %d");
        local_a0._16_8_ = auStack_108._0_8_;
        uVar4 = local_118._8_8_;
        _Var2._M_p = local_a0 + 0x10;
        if ((undefined1 *)local_118._0_8_ == auStack_108) {
          local_a0._24_8_ = auStack_108._8_8_;
          local_a0._0_8_ = _Var2._M_p;
        }
        else {
          local_a0._0_8_ = local_118._0_8_;
        }
        local_118._8_8_ = (pointer)0x0;
        auStack_108._0_8_ = auStack_108._0_8_ & 0xffffffffffffff00;
        *(size_type **)&__return_storage_ptr__->field_0 = local_e0;
        if ((pointer)local_a0._0_8_ == _Var2._M_p) {
          *local_e0 = local_a0._16_8_;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e0 + 1))->_M_allocated_capacity = local_a0._24_8_;
        }
        else {
          *(undefined8 *)&__return_storage_ptr__->field_0 = local_a0._0_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_a0._16_8_;
        }
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar4;
        local_a0._8_8_ = (char *)0x0;
        local_a0._16_8_ = local_a0._16_8_ & 0xffffffffffffff00;
        __return_storage_ptr__->has_value_ = false;
        local_118._0_8_ = auStack_108;
        local_a0._0_8_ = _Var2._M_p;
      }
      if (local_138 != pcVar1) {
        operator_delete(local_138,(ulong)(local_130._8_8_ + 1));
      }
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<Value, std::string> readAnyValue() {
		enum class State {
			Init,
			StreamStarted,
			DocumentStarted,
		};

		for(State state = State::Init; state != State::DocumentStarted;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading mapping: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_STREAM_START_EVENT:
					if (state != State::Init)
						return Unexpected<std::string>("Unexpected YAML_STREAM_START_EVENT");
					state = State::StreamStarted;
					break;
				case YAML_DOCUMENT_START_EVENT:
					if (state != State::StreamStarted)
						return Unexpected<std::string>("Unexpected YAML_DOCUMENT_START_EVENT");
					state = State::DocumentStarted;
					break;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			} // switch (event.type)
		} // for(state != DocumentStarted)

		auto event_result = getNextEvent();
		if (!event_result)
			return Unexpected("Error while reading mapping: " + event_result.error());
		YamlEvent event = std::move(event_result).value();

		switch (event.type) {
			case YAML_SCALAR_EVENT:
				MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
				return Value(std::move(event.value));
			case YAML_SEQUENCE_START_EVENT:
				MSG("YAML_SEQUENCE_START_EVENT");
				{
					auto result = readSequence();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			case YAML_MAPPING_START_EVENT:
				MSG("YAML_MAPPING_START_EVENT");
				{
					auto result = readMapping();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			default:
				return Unexpected(format("Unexpected event %d", event.type));
		}
	}